

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* httplib::make_bearer_token_authentication_header
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *token,bool is_proxy)

{
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  char *local_48;
  char *key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field;
  bool is_proxy_local;
  string *token_local;
  
  field.field_2._M_local_buf[0xf] = is_proxy;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,"Bearer "
                 ,token);
  local_48 = "Authorization";
  if ((field.field_2._M_local_buf[0xf] & 1U) != 0) {
    local_48 = "Proxy-Authorization";
  }
  std::make_pair<char_const*&,std::__cxx11::string>
            (&local_70,&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,&local_70);
  std::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_70);
  std::__cxx11::string::~string((string *)&key);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string, std::string>
make_bearer_token_authentication_header(const std::string &token,
                                        bool is_proxy = false) {
  auto field = "Bearer " + token;
  auto key = is_proxy ? "Proxy-Authorization" : "Authorization";
  return std::make_pair(key, std::move(field));
}